

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

void __thiscall
Am_Inter_Location::Set_Ref_Obj(Am_Inter_Location *this,Am_Object *ref_obj,bool make_unique)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Inter_Location_Data *this_00;
  bool make_unique_local;
  Am_Object *ref_obj_local;
  Am_Inter_Location *this_local;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    this_00 = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data::Am_Inter_Location_Data(this_00);
    this->data = this_00;
  }
  else if (make_unique) {
    iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    this->data = (Am_Inter_Location_Data *)CONCAT44(extraout_var,iVar1);
  }
  Am_Object::operator=(&this->data->ref_obj,ref_obj);
  return;
}

Assistant:

void
Am_Inter_Location::Set_Ref_Obj(const Am_Object &ref_obj, bool make_unique)
{
  if (data) {
    if (make_unique)
      data = (Am_Inter_Location_Data *)data->Make_Unique();
  } else
    data = new Am_Inter_Location_Data();
  data->ref_obj = ref_obj;
}